

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# welcome_message_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::WelcomeMessageTest_test_equals_different_Test::TestBody
          (WelcomeMessageTest_test_equals_different_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  AssertHelper local_40;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38 [3];
  internal local_20 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  bidfx_public_api::price::pixie::WelcomeMessage::WelcomeMessage
            ((WelcomeMessage *)local_38,VERSION + 1,CLIENT_ID,SERVER_ID);
  testing::internal::
  CmpHelperNE<bidfx_public_api::price::pixie::WelcomeMessage,bidfx_public_api::price::pixie::WelcomeMessage>
            (local_20,"WELCOME_MESSAGE","WelcomeMessage(VERSION + 1, CLIENT_ID, SERVER_ID)",
             (WelcomeMessage *)WELCOME_MESSAGE,(WelcomeMessage *)local_38);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_38);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/welcome_message_test.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_38[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_38[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38[0].ptr_ + 8))();
      }
      local_38[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::price::pixie::WelcomeMessage::WelcomeMessage
            ((WelcomeMessage *)local_38,VERSION,CLIENT_ID + 1,SERVER_ID);
  testing::internal::
  CmpHelperNE<bidfx_public_api::price::pixie::WelcomeMessage,bidfx_public_api::price::pixie::WelcomeMessage>
            (local_20,"WELCOME_MESSAGE","WelcomeMessage(VERSION, CLIENT_ID + 1, SERVER_ID)",
             (WelcomeMessage *)WELCOME_MESSAGE,(WelcomeMessage *)local_38);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_38);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/welcome_message_test.cpp"
               ,0x56,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_38[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_38[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38[0].ptr_ + 8))();
      }
      local_38[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::price::pixie::WelcomeMessage::WelcomeMessage
            ((WelcomeMessage *)local_38,VERSION,CLIENT_ID,SERVER_ID + 1);
  testing::internal::
  CmpHelperNE<bidfx_public_api::price::pixie::WelcomeMessage,bidfx_public_api::price::pixie::WelcomeMessage>
            (local_20,"WELCOME_MESSAGE","WelcomeMessage(VERSION, CLIENT_ID, SERVER_ID + 1)",
             (WelcomeMessage *)WELCOME_MESSAGE,(WelcomeMessage *)local_38);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_38);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/welcome_message_test.cpp"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_38[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_38[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38[0].ptr_ + 8))();
      }
      local_38[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(WelcomeMessageTest, test_equals_different)
{
    EXPECT_NE(WELCOME_MESSAGE, WelcomeMessage(VERSION + 1, CLIENT_ID, SERVER_ID));
    EXPECT_NE(WELCOME_MESSAGE, WelcomeMessage(VERSION, CLIENT_ID + 1, SERVER_ID));
    EXPECT_NE(WELCOME_MESSAGE, WelcomeMessage(VERSION, CLIENT_ID, SERVER_ID + 1));
}